

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O1

void __thiscall Assimp::ASE::Parser::ParseLV1SceneBlock(Parser *this)

{
  char cVar1;
  byte bVar2;
  char *pcVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  char *pcVar7;
  uint *iOut;
  int iVar8;
  
  iVar8 = 0;
LAB_0040f7fe:
  do {
    pcVar3 = this->filePtr;
    cVar1 = *pcVar3;
    if (cVar1 != '*') {
      if (cVar1 == '\0') {
        return;
      }
      if (cVar1 == '{') {
        iVar8 = iVar8 + 1;
      }
      else if ((cVar1 == '}') && (iVar8 = iVar8 + -1, iVar8 == 0)) {
        this->filePtr = pcVar3 + 1;
        SkipToNextToken(this);
        return;
      }
      goto LAB_0040fa37;
    }
    this->filePtr = pcVar3 + 1;
    iVar4 = strncmp("SCENE_BACKGROUND_STATIC",pcVar3 + 1,0x17);
    if (iVar4 == 0) {
      bVar2 = pcVar3[0x18];
      if (((ulong)bVar2 < 0x21) && ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
        pcVar7 = pcVar3 + 0x19;
        if (bVar2 == 0) {
          pcVar7 = pcVar3 + 0x18;
        }
        this->filePtr = pcVar7;
        lVar6 = 8;
        do {
          ParseLV4MeshFloat(this,(ai_real *)((long)&this->filePtr + lVar6));
          lVar6 = lVar6 + 4;
        } while (lVar6 != 0x14);
        goto LAB_0040f7fe;
      }
    }
    pcVar3 = this->filePtr;
    iVar4 = strncmp("SCENE_AMBIENT_STATIC",pcVar3,0x14);
    if (iVar4 == 0) {
      bVar2 = pcVar3[0x14];
      if ((0x20 < (ulong)bVar2) || ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) == 0))
      goto LAB_0040f845;
      pcVar7 = pcVar3 + 0x15;
      if (bVar2 == 0) {
        pcVar7 = pcVar3 + 0x14;
      }
      this->filePtr = pcVar7;
      lVar6 = 0x14;
      do {
        ParseLV4MeshFloat(this,(ai_real *)((long)&this->filePtr + lVar6));
        lVar6 = lVar6 + 4;
      } while (lVar6 != 0x20);
    }
    else {
LAB_0040f845:
      pcVar3 = this->filePtr;
      iVar4 = strncmp("SCENE_FIRSTFRAME",pcVar3,0x10);
      if (iVar4 == 0) {
        bVar2 = pcVar3[0x10];
        if ((0x20 < (ulong)bVar2) || ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) == 0))
        goto LAB_0040f864;
        pcVar7 = pcVar3 + 0x11;
        iOut = &this->iFirstFrame;
        if (bVar2 == 0) {
          pcVar7 = pcVar3 + 0x10;
        }
LAB_0040fa24:
        this->filePtr = pcVar7;
        ParseLV4MeshLong(this,iOut);
      }
      else {
LAB_0040f864:
        pcVar3 = this->filePtr;
        iVar4 = strncmp("SCENE_LASTFRAME",pcVar3,0xf);
        if (iVar4 == 0) {
          bVar2 = pcVar3[0xf];
          if (((ulong)bVar2 < 0x21) && ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
            pcVar7 = pcVar3 + 0x10;
            iOut = &this->iLastFrame;
            if (bVar2 == 0) {
              pcVar7 = pcVar3 + 0xf;
            }
            goto LAB_0040fa24;
          }
        }
        pcVar3 = this->filePtr;
        iVar4 = strncmp("SCENE_FRAMESPEED",pcVar3,0x10);
        if (iVar4 == 0) {
          bVar2 = pcVar3[0x10];
          if (((ulong)bVar2 < 0x21) && ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
            pcVar7 = pcVar3 + 0x11;
            iOut = &this->iFrameSpeed;
            if (bVar2 == 0) {
              pcVar7 = pcVar3 + 0x10;
            }
            goto LAB_0040fa24;
          }
        }
        pcVar3 = this->filePtr;
        iVar4 = strncmp("SCENE_TICKSPERFRAME",pcVar3,0x13);
        if (iVar4 == 0) {
          bVar2 = pcVar3[0x13];
          if (((ulong)bVar2 < 0x21) && ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
            pcVar7 = pcVar3 + 0x14;
            iOut = &this->iTicksPerFrame;
            if (bVar2 == 0) {
              pcVar7 = pcVar3 + 0x13;
            }
            goto LAB_0040fa24;
          }
        }
LAB_0040fa37:
        uVar5 = (uint)(byte)*this->filePtr;
        if (((uVar5 < 0xe) && ((0x3401U >> (uVar5 & 0x1f) & 1) != 0)) &&
           (this->bLastWasEndLine == false)) {
          this->iLineNumber = this->iLineNumber + 1;
          this->bLastWasEndLine = true;
        }
        else {
          this->bLastWasEndLine = false;
        }
        this->filePtr = this->filePtr + 1;
      }
    }
  } while( true );
}

Assistant:

void Parser::ParseLV1SceneBlock()
{
    AI_ASE_PARSER_INIT();
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;
            if (TokenMatch(filePtr,"SCENE_BACKGROUND_STATIC",23))

            {
                // parse a color triple and assume it is really the bg color
                ParseLV4MeshFloatTriple( &m_clrBackground.r );
                continue;
            }
            if (TokenMatch(filePtr,"SCENE_AMBIENT_STATIC",20))

            {
                // parse a color triple and assume it is really the bg color
                ParseLV4MeshFloatTriple( &m_clrAmbient.r );
                continue;
            }
            if (TokenMatch(filePtr,"SCENE_FIRSTFRAME",16))
            {
                ParseLV4MeshLong(iFirstFrame);
                continue;
            }
            if (TokenMatch(filePtr,"SCENE_LASTFRAME",15))
            {
                ParseLV4MeshLong(iLastFrame);
                continue;
            }
            if (TokenMatch(filePtr,"SCENE_FRAMESPEED",16))
            {
                ParseLV4MeshLong(iFrameSpeed);
                continue;
            }
            if (TokenMatch(filePtr,"SCENE_TICKSPERFRAME",19))
            {
                ParseLV4MeshLong(iTicksPerFrame);
                continue;
            }
        }
        AI_ASE_HANDLE_TOP_LEVEL_SECTION();
    }
}